

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O0

void __thiscall TPZCheckMesh::DependencyReport(TPZCheckMesh *this,int connect)

{
  ostream *this_00;
  void *this_01;
  int in_ESI;
  long in_RDI;
  TPZCompElSide large;
  int in_stack_00000034;
  TPZCheckMesh *in_stack_00000038;
  TPZCompElSide *in_stack_000002f0;
  int in_stack_000002fc;
  TPZCheckMesh *in_stack_00000300;
  
  this_00 = std::operator<<(*(ostream **)(in_RDI + 8),"DependencyReport for connect ");
  this_01 = (void *)std::ostream::operator<<(this_00,in_ESI);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  FindElement(in_stack_00000038,in_stack_00000034);
  DependencyReport(in_stack_00000300,in_stack_000002fc,in_stack_000002f0);
  return;
}

Assistant:

void TPZCheckMesh::DependencyReport(int connect) {
	
	(*fOut) << "DependencyReport for connect " << connect << endl;
	TPZCompElSide large = FindElement(connect);
	DependencyReport(connect, large);
}